

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPersistenceManager.cpp
# Opt level: O2

TPZSavable * TPZPersistenceManager::GetInstance(int64_t *objId)

{
  bool bVar1;
  TPZSavable *pTVar2;
  size_t sVar3;
  
  if (*objId == -1) {
    return (TPZSavable *)0x0;
  }
  bVar1 = TPZRestoredInstance::IsAlreadyRead(mObjVec.fStore + *objId);
  if (!bVar1) {
    TPZRestoredInstance::SetRead(mObjVec.fStore + *objId);
    pTVar2 = TPZRestoredInstance::GetPointerToMyObj(mObjVec.fStore + *objId);
    (*pTVar2->_vptr_TPZSavable[6])(pTVar2,&(mChunksVec.fStore[*objId].fRef)->fPointer->mNewStream,0)
    ;
    sVar3 = TPZContBufferedStream::Size(&(mChunksVec.fStore[*objId].fRef)->fPointer->mNewStream);
    if (sVar3 != 0) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Save/TPZPersistenceManager.cpp"
                 ,0x1bb);
    }
  }
  pTVar2 = TPZRestoredInstance::GetPointerToMyObj(mObjVec.fStore + *objId);
  return pTVar2;
}

Assistant:

TPZSavable *TPZPersistenceManager::GetInstance(const int64_t &objId) {
    if (objId != -1) {
        if (!mObjVec[objId].IsAlreadyRead()) {
            mObjVec[objId].SetRead();
            mObjVec[objId].GetPointerToMyObj()->Read(mChunksVec[objId]->mNewStream, NULL);
            if (mChunksVec[objId]->mNewStream.Size() != 0) {
                DebugStop();
            }
        }
        return mObjVec[objId].GetPointerToMyObj();
    }
    return NULL;
}